

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

void ThrustThingHelper(AActor *it,DAngle *angle,double force,INTBOOL nolimit)

{
  double dVar1;
  TAngle<double> local_30;
  INTBOOL local_24;
  double dStack_20;
  INTBOOL nolimit_local;
  double force_local;
  DAngle *angle_local;
  AActor *it_local;
  
  local_24 = nolimit;
  dStack_20 = force;
  force_local = (double)angle;
  angle_local = (DAngle *)it;
  TAngle<double>::TAngle(&local_30,angle);
  AActor::Thrust(it,&local_30,dStack_20);
  if (local_24 == 0) {
    dVar1 = clamp<double>(angle_local[0x15].Degrees,-30.0,30.0);
    angle_local[0x15].Degrees = dVar1;
    dVar1 = clamp<double>(angle_local[0x16].Degrees,-30.0,30.0);
    angle_local[0x16].Degrees = dVar1;
  }
  return;
}

Assistant:

static void ThrustThingHelper(AActor *it, DAngle angle, double force, INTBOOL nolimit)
{
	it->Thrust(angle, force);
	if (!nolimit)
	{
		it->Vel.X = clamp(it->Vel.X, -MAXMOVE, MAXMOVE);
		it->Vel.Y = clamp(it->Vel.Y, -MAXMOVE, MAXMOVE);
	}
}